

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_manager.cc
# Opt level: O1

RC __thiscall QL_Manager::SetUpPrinterInsert(QL_Manager *this,DataAttrInfo *attributes)

{
  char *pcVar1;
  AttrCatEntry *pAVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  int *piVar8;
  
  if (0 < this->relEntries->attrCount) {
    piVar8 = &attributes->indexNo;
    lVar6 = 0;
    lVar7 = 0;
    do {
      pcVar1 = this->attrEntries->relName + lVar6;
      uVar3 = *(undefined8 *)pcVar1;
      uVar4 = *(undefined8 *)(pcVar1 + 8);
      pcVar1 = this->attrEntries->relName + lVar6 + 9;
      uVar5 = *(undefined8 *)(pcVar1 + 8);
      *(undefined8 *)((long)piVar8 + -0x37) = *(undefined8 *)pcVar1;
      *(undefined8 *)((long)piVar8 + -0x2f) = uVar5;
      *(undefined8 *)((DataAttrInfo *)(piVar8 + -0x10))->relName = uVar3;
      *(undefined8 *)(piVar8 + -0xe) = uVar4;
      pcVar1 = this->attrEntries->attrName + lVar6;
      uVar3 = *(undefined8 *)pcVar1;
      uVar4 = *(undefined8 *)(pcVar1 + 8);
      pcVar1 = this->attrEntries->attrName + lVar6 + 9;
      uVar5 = *(undefined8 *)(pcVar1 + 8);
      *(undefined8 *)((long)piVar8 + -0x1e) = *(undefined8 *)pcVar1;
      *(undefined8 *)((long)piVar8 + -0x16) = uVar5;
      *(undefined8 *)((long)piVar8 + -0x27) = uVar3;
      *(undefined8 *)((long)piVar8 + -0x1f) = uVar4;
      pAVar2 = this->attrEntries;
      piVar8[-2] = *(AttrType *)(pAVar2->attrName + lVar6 + 0x1f);
      piVar8[-1] = *(int *)(pAVar2->attrName + lVar6 + 0x23);
      *piVar8 = *(int *)(pAVar2->attrName + lVar6 + 0x27);
      piVar8[-3] = *(int *)(pAVar2->attrName + lVar6 + 0x1b);
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0x54;
      piVar8 = piVar8 + 0x11;
    } while (lVar7 < this->relEntries->attrCount);
  }
  return 0;
}

Assistant:

RC QL_Manager::SetUpPrinterInsert(DataAttrInfo *attributes){
  RC rc = 0;
  for(int i=0; i < relEntries->attrCount ; i++){
    memcpy(attributes[i].relName, attrEntries[i].relName, MAXNAME +1);
    memcpy(attributes[i].attrName, attrEntries[i].attrName, MAXNAME + 1);
    attributes[i].attrType = attrEntries[i].attrType;
    attributes[i].attrLength = attrEntries[i].attrLength;
    attributes[i].indexNo = attrEntries[i].indexNo;
    attributes[i].offset = attrEntries[i].offset;
  }
  return (0);
}